

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix3 * matrix3_inverse(matrix3 *self,matrix3 *mR)

{
  short sVar1;
  double f1;
  byte local_71;
  uint8_t i;
  double determinant;
  matrix3 inverse;
  matrix3 *mR_local;
  matrix3 *self_local;
  
  inverse.field_0.m[8] = (double)mR;
  f1 = matrix3_determinant(self);
  sVar1 = scalar_equalsf(f1,0.0);
  if (sVar1 == 0) {
    matrix3_identity((matrix3 *)&determinant);
    determinant = (self->field_0).m[4] * (self->field_0).m[8] +
                  -((self->field_0).m[7] * (self->field_0).m[5]);
    inverse.field_0.m[0] =
         (self->field_0).m[7] * (self->field_0).m[2] +
         -((self->field_0).m[1] * (self->field_0).m[8]);
    inverse.field_0.m[1] =
         (self->field_0).m[1] * (self->field_0).m[5] +
         -((self->field_0).m[4] * (self->field_0).m[2]);
    inverse.field_0.m[2] =
         (self->field_0).m[5] * (self->field_0).m[6] +
         -((self->field_0).m[8] * (self->field_0).m[3]);
    inverse.field_0.m[3] =
         (self->field_0).m[8] * (self->field_0).m[0] +
         -((self->field_0).m[2] * (self->field_0).m[6]);
    inverse.field_0.m[4] =
         (self->field_0).m[2] * (self->field_0).m[3] +
         -((self->field_0).m[5] * (self->field_0).m[0]);
    inverse.field_0.m[5] =
         (self->field_0).m[3] * (self->field_0).m[7] +
         -((self->field_0).m[6] * (self->field_0).m[4]);
    inverse.field_0.m[6] =
         (self->field_0).m[6] * (self->field_0).m[1] +
         -((self->field_0).m[0] * (self->field_0).m[7]);
    inverse.field_0.m[7] =
         (self->field_0).m[0] * (self->field_0).m[4] +
         -((self->field_0).m[3] * (self->field_0).m[1]);
    for (local_71 = 0; local_71 < 9; local_71 = local_71 + 1) {
      *(double *)((long)inverse.field_0.m[8] + (ulong)local_71 * 8) =
           (&determinant)[local_71] * (1.0 / f1);
    }
    self_local = (matrix3 *)inverse.field_0.m[8];
  }
  else {
    self_local = (matrix3 *)0x0;
  }
  return self_local;
}

Assistant:

HYPAPI struct matrix3 *matrix3_inverse(const struct matrix3 *self, struct matrix3 *mR)
{
	struct matrix3 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix3_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	matrix3_identity(&inverse);

	/* find the adjugate of self */
	B(11) = A2(22, 33) - A2(32, 23);
	B(12) = A2(32, 13) - A2(12, 33);
	B(13) = A2(12, 23) - A2(22, 13);

	B(21) = A2(23, 31) - A2(33, 21);
	B(22) = A2(33, 11) - A2(13, 31);
	B(23) = A2(13, 21) - A2(23, 11);

	B(31) = A2(21, 32) - A2(31, 22);
	B(32) = A2(31, 12) - A2(11, 32);
	B(33) = A2(11, 22) - A2(21, 12);

	/* divide the determinant */
	for (i = 0; i < 9; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}